

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void sublist(char *s,int *skip,int *count,int *numargs)

{
  char cVar1;
  tagval *ptVar2;
  char *__src;
  bool bVar3;
  char *__dest;
  size_t sVar4;
  uint uVar5;
  char *pcVar6;
  int iVar7;
  char *pcVar8;
  char *qend;
  char *list;
  char *end;
  char *start;
  char *qstart;
  char *local_68;
  char *local_60;
  ulong local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  uVar5 = *skip;
  local_58 = (ulong)uVar5;
  iVar7 = -1;
  if (2 < *numargs) {
    iVar7 = 0;
    if (0 < *count) {
      iVar7 = *count;
    }
  }
  local_68 = s;
  if (0 < (int)uVar5) {
    do {
      uVar5 = uVar5 - 1;
      bVar3 = parselist(&local_68,&liststart,&listend,&listquotestart,&listquoteend);
      if (!bVar3) break;
    } while (uVar5 != 0);
  }
  pcVar8 = local_68;
  if (iVar7 < 0) {
    pcVar6 = local_68;
    if (0 < (int)local_58) {
      sVar4 = strspn(local_68," \t\r\n");
      pcVar6 = pcVar8 + sVar4;
      if (pcVar8[sVar4] == '/') {
        cVar1 = pcVar6[1];
        while (cVar1 == '/') {
          sVar4 = strcspn(pcVar6,"\n");
          pcVar8 = pcVar6 + sVar4;
          sVar4 = strspn(pcVar8," \t\r\n");
          pcVar6 = pcVar8 + sVar4;
          if (pcVar8[sVar4] != '/') break;
          cVar1 = pcVar6[1];
        }
      }
    }
    ptVar2 = commandret;
    sVar4 = strlen(pcVar6);
    pcVar8 = (char *)operator_new__(sVar4 + 1);
    strncpy(pcVar8,pcVar6,sVar4 + 1);
    pcVar8[sVar4] = '\0';
    ptVar2->type = 3;
    (ptVar2->super_identval).field_0.s = pcVar8;
  }
  else {
    local_50 = local_68;
    local_60 = local_68;
    if ((iVar7 != 0) &&
       (bVar3 = parselist(&local_68,&local_40,&local_48,&local_50,&local_60), bVar3)) {
      iVar7 = iVar7 + 1;
      do {
        iVar7 = iVar7 + -1;
        if (iVar7 < 2) break;
        bVar3 = parselist(&local_68,&local_40,&local_48,&local_38,&local_60);
      } while (bVar3);
    }
    __src = local_50;
    pcVar6 = local_60;
    ptVar2 = commandret;
    pcVar8 = local_60 + (1 - (long)local_50);
    __dest = (char *)operator_new__((ulong)pcVar8);
    strncpy(__dest,__src,(size_t)pcVar8);
    pcVar6[(long)__dest - (long)__src] = '\0';
    ptVar2->type = 3;
    (ptVar2->super_identval).field_0.s = __dest;
  }
  return;
}

Assistant:

void sublist(const char *s, int *skip, int *count, int *numargs)
{
    int offset = max(*skip, 0), len = *numargs >= 3 ? max(*count, 0) : -1;
    loopi(offset) if(!parselist(s)) break;
    if(len < 0) { if(offset > 0) skiplist(s); commandret->setstr(newstring(s)); return; }
    const char *list = s, *start, *end, *qstart, *qend = s;
    if(len > 0 && parselist(s, start, end, list, qend)) while(--len > 0 && parselist(s, start, end, qstart, qend));
    commandret->setstr(newstring(list, qend - list));
}